

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

int on_ack_max_stream_data
              (quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,quicly_sent_t *sent)

{
  quicly_maxsender_t *m;
  int iVar1;
  quicly_stream_t *stream;
  quicly_maxsender_sent_t *sent_00;
  
  stream = quicly_get_stream((quicly_conn_t *)&map[-0x28].num_packets,(sent->data).stream.stream_id)
  ;
  if (stream != (quicly_stream_t *)0x0) {
    m = &(stream->_send_aux).max_stream_data_sender;
    sent_00 = &(sent->data).max_stream_data.args;
    if (acked == 0) {
      quicly_maxsender_lost(m,sent_00);
      iVar1 = should_send_max_stream_data(stream);
      if (iVar1 != 0) {
        sched_stream_control(stream);
      }
    }
    else {
      quicly_maxsender_acked(m,sent_00);
    }
  }
  return 0;
}

Assistant:

static int on_ack_max_stream_data(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_stream_t *stream;

    if ((stream = quicly_get_stream(conn, sent->data.stream.stream_id)) != NULL) {
        if (acked) {
            quicly_maxsender_acked(&stream->_send_aux.max_stream_data_sender, &sent->data.max_stream_data.args);
        } else {
            quicly_maxsender_lost(&stream->_send_aux.max_stream_data_sender, &sent->data.max_stream_data.args);
            if (should_send_max_stream_data(stream))
                sched_stream_control(stream);
        }
    }

    return 0;
}